

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O0

void __thiscall xemmai::t_object::f_decrement_step(t_object *this)

{
  t_object *this_00;
  t_engine *this_01;
  t_object *this_local;
  
  f_scan_fields(this,f_push<&xemmai::t_object::f_decrement_push>);
  if (this->v_type->f_finalize != (_func_void_t_object_ptr_t_scan *)0x0) {
    (*this->v_type->f_finalize)(this,f_push<&xemmai::t_object::f_decrement_push>);
  }
  this_00 = f_of(this->v_type);
  f_decrement_push(this_00);
  this->v_type = (t_type *)0x0;
  if (this->v_next != (t_object *)0x0) {
    if (this->v_previous == (t_object *)0x0) {
      return;
    }
    this->v_next->v_previous = this->v_previous;
    this->v_previous->v_next = this->v_next;
  }
  this_01 = f_engine();
  t_engine::f_free_as_release(this_01,this);
  return;
}

Assistant:

inline void t_object::f_decrement_step()
{
	f_scan_fields(f_push<&t_object::f_decrement_push>);
	if (v_type->f_finalize) v_type->f_finalize(this, f_push<&t_object::f_decrement_push>);
	t_object::f_of(v_type)->f_decrement_push();
	v_type = nullptr;
	if (v_next) {
		if (!v_previous) return;
		v_next->v_previous = v_previous;
		v_previous->v_next = v_next;
	}
	f_engine()->f_free_as_release(this);
}